

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

btScalar __thiscall
btConvexHullComputer::compute
          (btConvexHullComputer *this,void *coords,bool doubleCoords,int stride,int count,
          btScalar shrink,btScalar shrinkClamp)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vertex *v;
  btVector3 *ptr;
  Edge *pEVar3;
  Edge *pEVar4;
  int *ptr_00;
  undefined8 uVar5;
  Edge **ppEVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  btVector3 *pbVar12;
  Edge *pEVar13;
  int *piVar14;
  Edge *pEVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  Edge *e;
  Edge *pEVar19;
  int sz;
  long lVar20;
  ulong uVar21;
  int iVar22;
  btVector3 bVar23;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> oldVertices;
  btConvexHullInternal hull;
  btScalar local_140;
  btScalar local_138;
  btScalar bStack_134;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> local_110;
  btConvexHullInternal local_f0;
  
  if (count < 1) {
    pbVar12 = (this->vertices).m_data;
    if ((pbVar12 != (btVector3 *)0x0) && ((this->vertices).m_ownsMemory == true)) {
      btAlignedFreeInternal(pbVar12);
    }
    (this->vertices).m_ownsMemory = true;
    (this->vertices).m_data = (btVector3 *)0x0;
    (this->vertices).m_size = 0;
    (this->vertices).m_capacity = 0;
    pEVar13 = (this->edges).m_data;
    if ((pEVar13 != (Edge *)0x0) && ((this->edges).m_ownsMemory == true)) {
      btAlignedFreeInternal(pEVar13);
    }
    (this->edges).m_ownsMemory = true;
    (this->edges).m_data = (Edge *)0x0;
    (this->edges).m_size = 0;
    (this->edges).m_capacity = 0;
    piVar14 = (this->faces).m_data;
    if ((piVar14 != (int *)0x0) && ((this->faces).m_ownsMemory == true)) {
      btAlignedFreeInternal(piVar14);
    }
    (this->faces).m_ownsMemory = true;
    (this->faces).m_data = (int *)0x0;
    (this->faces).m_size = 0;
    (this->faces).m_capacity = 0;
    local_140 = 0.0;
  }
  else {
    local_f0.vertexPool.arrays = (PoolArray<btConvexHullInternal::Vertex> *)0x0;
    local_f0.vertexPool.nextArray = (PoolArray<btConvexHullInternal::Vertex> *)0x0;
    local_f0.vertexPool.freeObjects = (Vertex *)0x0;
    local_f0.vertexPool.arraySize = 0x100;
    local_f0.edgePool.arrays = (PoolArray<btConvexHullInternal::Edge> *)0x0;
    local_f0.edgePool.nextArray = (PoolArray<btConvexHullInternal::Edge> *)0x0;
    local_f0.edgePool.freeObjects = (Edge *)0x0;
    local_f0.edgePool.arraySize = 0x100;
    local_f0.facePool.arrays = (PoolArray<btConvexHullInternal::Face> *)0x0;
    local_f0.facePool.nextArray = (PoolArray<btConvexHullInternal::Face> *)0x0;
    local_f0.facePool.freeObjects = (Face *)0x0;
    local_f0.facePool.arraySize = 0x100;
    local_f0.originalVertices.m_ownsMemory = true;
    local_f0.originalVertices.m_data = (Vertex **)0x0;
    local_f0.originalVertices.m_size = 0;
    local_f0.originalVertices.m_capacity = 0;
    btConvexHullInternal::compute(&local_f0,coords,doubleCoords,stride,count);
    local_140 = 0.0;
    if ((shrink <= 0.0) ||
       (local_140 = btConvexHullInternal::shrink(&local_f0,shrink,shrinkClamp), 0.0 <= local_140)) {
      if (((this->vertices).m_size < 0) && ((this->vertices).m_capacity < 0)) {
        pbVar12 = (this->vertices).m_data;
        if ((pbVar12 != (btVector3 *)0x0) && ((this->vertices).m_ownsMemory == true)) {
          btAlignedFreeInternal(pbVar12);
        }
        (this->vertices).m_ownsMemory = true;
        (this->vertices).m_data = (btVector3 *)0x0;
        (this->vertices).m_capacity = 0;
      }
      (this->vertices).m_size = 0;
      lVar20 = (long)(this->edges).m_size;
      if (lVar20 < 0) {
        if ((this->edges).m_capacity < 0) {
          pEVar13 = (this->edges).m_data;
          if ((pEVar13 != (Edge *)0x0) && ((this->edges).m_ownsMemory == true)) {
            btAlignedFreeInternal(pEVar13);
          }
          (this->edges).m_ownsMemory = true;
          (this->edges).m_data = (Edge *)0x0;
          (this->edges).m_capacity = 0;
        }
        lVar11 = lVar20 * 0xc;
        do {
          pEVar13 = (this->edges).m_data;
          *(undefined4 *)((long)&pEVar13->targetVertex + lVar11) = 0;
          *(undefined8 *)((long)&pEVar13->next + lVar11) = 0;
          lVar11 = lVar11 + 0xc;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0);
      }
      (this->edges).m_size = 0;
      lVar20 = (long)(this->faces).m_size;
      if (lVar20 < 0) {
        piVar14 = (this->faces).m_data;
        if ((this->faces).m_capacity < 0) {
          if (piVar14 == (int *)0x0) {
            (this->faces).m_ownsMemory = true;
          }
          else {
            if ((this->faces).m_ownsMemory == true) {
              btAlignedFreeInternal(piVar14);
            }
            (this->faces).m_ownsMemory = true;
            (this->faces).m_data = (int *)0x0;
          }
          (this->faces).m_capacity = 0;
          piVar14 = (int *)0x0;
        }
        memset(piVar14 + lVar20,0,lVar20 * -4);
      }
      (this->faces).m_size = 0;
      local_110.m_ownsMemory = true;
      local_110.m_data = (Vertex **)0x0;
      local_110.m_size = 0;
      local_110.m_capacity = 0;
      getVertexCopy(local_f0.vertexList,&local_110);
      if (0 < local_110.m_size) {
        uVar21 = 0;
        do {
          v = local_110.m_data[uVar21];
          bVar23 = btConvexHullInternal::getCoordinates(&local_f0,v);
          uVar8 = (this->vertices).m_size;
          if (uVar8 == (this->vertices).m_capacity) {
            iVar17 = uVar8 * 2;
            if (uVar8 == 0) {
              iVar17 = 1;
            }
            if ((int)uVar8 < iVar17) {
              if (iVar17 == 0) {
                pbVar12 = (btVector3 *)0x0;
              }
              else {
                pbVar12 = (btVector3 *)btAlignedAllocInternal((long)iVar17 << 4,0x10);
                uVar8 = (this->vertices).m_size;
              }
              if (0 < (int)uVar8) {
                lVar20 = 0;
                do {
                  puVar1 = (undefined8 *)((long)((this->vertices).m_data)->m_floats + lVar20);
                  uVar5 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pbVar12->m_floats + lVar20);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar5;
                  lVar20 = lVar20 + 0x10;
                } while ((ulong)uVar8 << 4 != lVar20);
              }
              ptr = (this->vertices).m_data;
              if ((ptr != (btVector3 *)0x0) && ((this->vertices).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr);
              }
              (this->vertices).m_ownsMemory = true;
              (this->vertices).m_data = pbVar12;
              (this->vertices).m_capacity = iVar17;
              uVar8 = (this->vertices).m_size;
            }
          }
          local_138 = bVar23.m_floats[0];
          bStack_134 = bVar23.m_floats[1];
          pbVar12 = (this->vertices).m_data + (int)uVar8;
          pbVar12->m_floats[0] = local_138;
          pbVar12->m_floats[1] = bStack_134;
          pbVar12->m_floats[2] = bVar23.m_floats[2];
          pbVar12->m_floats[3] = bVar23.m_floats[3];
          piVar14 = &(this->vertices).m_size;
          *piVar14 = *piVar14 + 1;
          pEVar3 = v->edges;
          if (pEVar3 != (Edge *)0x0) {
            iVar22 = -1;
            pEVar19 = pEVar3;
            iVar17 = -1;
            do {
              if (pEVar19->copy < 0) {
                uVar8 = (this->edges).m_size;
                uVar9 = uVar8;
                if (uVar8 == (this->edges).m_capacity) {
                  iVar10 = uVar8 * 2;
                  if (uVar8 == 0) {
                    iVar10 = 1;
                  }
                  if ((int)uVar8 < iVar10) {
                    if (iVar10 == 0) {
                      pEVar13 = (Edge *)0x0;
                    }
                    else {
                      pEVar13 = (Edge *)btAlignedAllocInternal((long)iVar10 * 0xc,0x10);
                      uVar9 = (this->edges).m_size;
                    }
                    if (0 < (int)uVar9) {
                      lVar20 = 0;
                      do {
                        pEVar4 = (this->edges).m_data;
                        *(undefined4 *)((long)&pEVar13->targetVertex + lVar20) =
                             *(undefined4 *)((long)&pEVar4->targetVertex + lVar20);
                        *(undefined8 *)((long)&pEVar13->next + lVar20) =
                             *(undefined8 *)((long)&pEVar4->next + lVar20);
                        lVar20 = lVar20 + 0xc;
                      } while ((ulong)uVar9 * 0xc != lVar20);
                    }
                    pEVar4 = (this->edges).m_data;
                    if ((pEVar4 != (Edge *)0x0) && ((this->edges).m_ownsMemory == true)) {
                      btAlignedFreeInternal(pEVar4);
                    }
                    (this->edges).m_ownsMemory = true;
                    (this->edges).m_data = pEVar13;
                    (this->edges).m_capacity = iVar10;
                    uVar9 = (this->edges).m_size;
                  }
                }
                pEVar13 = (this->edges).m_data;
                pEVar13[(int)uVar9].targetVertex = 0;
                pEVar13 = pEVar13 + (int)uVar9;
                pEVar13->next = 0;
                pEVar13->reverse = 0;
                uVar9 = (this->edges).m_size + 1;
                (this->edges).m_size = uVar9;
                if (uVar9 == (this->edges).m_capacity) {
                  iVar10 = uVar9 * 2;
                  if (uVar9 == 0) {
                    iVar10 = 1;
                  }
                  if ((int)uVar9 < iVar10) {
                    if (iVar10 == 0) {
                      pEVar13 = (Edge *)0x0;
                    }
                    else {
                      pEVar13 = (Edge *)btAlignedAllocInternal((long)iVar10 * 0xc,0x10);
                      uVar9 = (this->edges).m_size;
                    }
                    if (0 < (int)uVar9) {
                      lVar20 = 0;
                      do {
                        pEVar4 = (this->edges).m_data;
                        *(undefined4 *)((long)&pEVar13->targetVertex + lVar20) =
                             *(undefined4 *)((long)&pEVar4->targetVertex + lVar20);
                        *(undefined8 *)((long)&pEVar13->next + lVar20) =
                             *(undefined8 *)((long)&pEVar4->next + lVar20);
                        lVar20 = lVar20 + 0xc;
                      } while ((ulong)uVar9 * 0xc != lVar20);
                    }
                    pEVar4 = (this->edges).m_data;
                    if ((pEVar4 != (Edge *)0x0) && ((this->edges).m_ownsMemory == true)) {
                      btAlignedFreeInternal(pEVar4);
                    }
                    (this->edges).m_ownsMemory = true;
                    (this->edges).m_data = pEVar13;
                    (this->edges).m_capacity = iVar10;
                    uVar9 = (this->edges).m_size;
                  }
                }
                pEVar13 = (this->edges).m_data;
                pEVar13[(int)uVar9].targetVertex = 0;
                pEVar13 = pEVar13 + (int)uVar9;
                pEVar13->next = 0;
                pEVar13->reverse = 0;
                piVar14 = &(this->edges).m_size;
                *piVar14 = *piVar14 + 1;
                lVar20 = (long)(int)uVar8;
                pEVar13 = (this->edges).m_data;
                lVar11 = lVar20 + 1;
                pEVar19->copy = uVar8;
                pEVar19->reverse->copy = (int)lVar11;
                pEVar13[lVar20].reverse = 1;
                pEVar13[lVar11].reverse = -1;
                iVar10 = getVertexCopy(pEVar19->target,&local_110);
                pEVar13[lVar20].targetVertex = iVar10;
                pEVar13[lVar11].targetVertex = (int)uVar21;
              }
              iVar10 = pEVar19->copy;
              iVar7 = iVar10;
              if (-1 < iVar17) {
                (this->edges).m_data[iVar10].next = iVar17 - iVar10;
                iVar7 = iVar22;
              }
              iVar22 = iVar7;
              pEVar19 = pEVar19->next;
              iVar17 = iVar10;
            } while (pEVar19 != pEVar3);
            (this->edges).m_data[iVar22].next = iVar10 - iVar22;
          }
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)local_110.m_size);
        uVar18 = 0;
        do {
          pEVar3 = local_110.m_data[uVar18]->edges;
          pEVar19 = pEVar3;
          if (pEVar3 != (Edge *)0x0) {
            do {
              iVar17 = pEVar19->copy;
              if (-1 < iVar17) {
                uVar8 = (this->faces).m_size;
                if (uVar8 == (this->faces).m_capacity) {
                  iVar22 = uVar8 * 2;
                  if (uVar8 == 0) {
                    iVar22 = 1;
                  }
                  if ((int)uVar8 < iVar22) {
                    if (iVar22 == 0) {
                      piVar14 = (int *)0x0;
                    }
                    else {
                      piVar14 = (int *)btAlignedAllocInternal((long)iVar22 << 2,0x10);
                      uVar8 = (this->faces).m_size;
                    }
                    ptr_00 = (this->faces).m_data;
                    if ((int)uVar8 < 1) {
                      if (ptr_00 != (int *)0x0) goto LAB_0012d4f1;
                    }
                    else {
                      uVar16 = 0;
                      do {
                        piVar14[uVar16] = ptr_00[uVar16];
                        uVar16 = uVar16 + 1;
                      } while (uVar8 != uVar16);
LAB_0012d4f1:
                      if ((this->faces).m_ownsMemory == true) {
                        btAlignedFreeInternal(ptr_00);
                      }
                      uVar8 = (this->faces).m_size;
                    }
                    (this->faces).m_ownsMemory = true;
                    (this->faces).m_data = piVar14;
                    (this->faces).m_capacity = iVar22;
                    iVar17 = pEVar19->copy;
                  }
                }
                (this->faces).m_data[(int)uVar8] = iVar17;
                piVar14 = &(this->faces).m_size;
                *piVar14 = *piVar14 + 1;
                pEVar15 = pEVar19;
                do {
                  pEVar15->copy = -1;
                  pEVar15 = pEVar15->reverse->prev;
                } while (pEVar15 != pEVar19);
              }
              ppEVar6 = &pEVar19->next;
              pEVar19 = *ppEVar6;
            } while (*ppEVar6 != pEVar3);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != (uVar21 & 0xffffffff));
      }
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::~btAlignedObjectArray(&local_110);
    }
    else {
      pbVar12 = (this->vertices).m_data;
      if ((pbVar12 != (btVector3 *)0x0) && ((this->vertices).m_ownsMemory == true)) {
        btAlignedFreeInternal(pbVar12);
      }
      (this->vertices).m_ownsMemory = true;
      (this->vertices).m_data = (btVector3 *)0x0;
      (this->vertices).m_size = 0;
      (this->vertices).m_capacity = 0;
      pEVar13 = (this->edges).m_data;
      if ((pEVar13 != (Edge *)0x0) && ((this->edges).m_ownsMemory == true)) {
        btAlignedFreeInternal(pEVar13);
      }
      (this->edges).m_ownsMemory = true;
      (this->edges).m_data = (Edge *)0x0;
      (this->edges).m_size = 0;
      (this->edges).m_capacity = 0;
      piVar14 = (this->faces).m_data;
      if ((piVar14 != (int *)0x0) && ((this->faces).m_ownsMemory == true)) {
        btAlignedFreeInternal(piVar14);
      }
      (this->faces).m_ownsMemory = true;
      (this->faces).m_data = (int *)0x0;
      (this->faces).m_size = 0;
      (this->faces).m_capacity = 0;
    }
    btAlignedObjectArray<btConvexHullInternal::Vertex_*>::~btAlignedObjectArray
              (&local_f0.originalVertices);
    btConvexHullInternal::Pool<btConvexHullInternal::Face>::~Pool(&local_f0.facePool);
    btConvexHullInternal::Pool<btConvexHullInternal::Edge>::~Pool(&local_f0.edgePool);
    btConvexHullInternal::Pool<btConvexHullInternal::Vertex>::~Pool(&local_f0.vertexPool);
  }
  return local_140;
}

Assistant:

btScalar btConvexHullComputer::compute(const void* coords, bool doubleCoords, int stride, int count, btScalar shrink, btScalar shrinkClamp)
{
	if (count <= 0)
	{
		vertices.clear();
		edges.clear();
		faces.clear();
		return 0;
	}

	btConvexHullInternal hull;
	hull.compute(coords, doubleCoords, stride, count);

	btScalar shift = 0;
	if ((shrink > 0) && ((shift = hull.shrink(shrink, shrinkClamp)) < 0))
	{
		vertices.clear();
		edges.clear();
		faces.clear();
		return shift;
	}

	vertices.resize(0);
	edges.resize(0);
	faces.resize(0);

	btAlignedObjectArray<btConvexHullInternal::Vertex*> oldVertices;
	getVertexCopy(hull.vertexList, oldVertices);
	int copied = 0;
	while (copied < oldVertices.size())
	{
		btConvexHullInternal::Vertex* v = oldVertices[copied];
		vertices.push_back(hull.getCoordinates(v));
		btConvexHullInternal::Edge* firstEdge = v->edges;
		if (firstEdge)
		{
			int firstCopy = -1;
			int prevCopy = -1;
			btConvexHullInternal::Edge* e = firstEdge;
			do
			{
				if (e->copy < 0)
				{
					int s = edges.size();
					edges.push_back(Edge());
					edges.push_back(Edge());
					Edge* c = &edges[s];
					Edge* r = &edges[s + 1];
					e->copy = s;
					e->reverse->copy = s + 1;
					c->reverse = 1;
					r->reverse = -1;
					c->targetVertex = getVertexCopy(e->target, oldVertices);
					r->targetVertex = copied;
#ifdef DEBUG_CONVEX_HULL
					printf("      CREATE: Vertex *%d has edge to *%d\n", copied, c->getTargetVertex());
#endif
				}
				if (prevCopy >= 0)
				{
					edges[e->copy].next = prevCopy - e->copy;
				}
				else
				{
					firstCopy = e->copy;
				}
				prevCopy = e->copy;
				e = e->next;
			} while (e != firstEdge);
			edges[firstCopy].next = prevCopy - firstCopy;
		}
		copied++;
	}

	for (int i = 0; i < copied; i++)
	{
		btConvexHullInternal::Vertex* v = oldVertices[i];
		btConvexHullInternal::Edge* firstEdge = v->edges;
		if (firstEdge)
		{
			btConvexHullInternal::Edge* e = firstEdge;
			do
			{
				if (e->copy >= 0)
				{
#ifdef DEBUG_CONVEX_HULL
					printf("Vertex *%d has edge to *%d\n", i, edges[e->copy].getTargetVertex());
#endif
					faces.push_back(e->copy);
					btConvexHullInternal::Edge* f = e;
					do
					{
#ifdef DEBUG_CONVEX_HULL
						printf("   Face *%d\n", edges[f->copy].getTargetVertex());
#endif
						f->copy = -1;
						f = f->reverse->prev;
					} while (f != e);
				}
				e = e->next;
			} while (e != firstEdge);
		}
	}

	return shift;
}